

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O3

void Wlc_NtkPrintCex(Wlc_Ntk_t *p,Wlc_Ntk_t *pAbs,Abc_Cex_t *pCex)

{
  Wlc_Obj_t *pWVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  
  if (pCex == (Abc_Cex_t *)0x0) {
    puts("The CEX is NULL.");
    return;
  }
  if (-1 < pCex->iFrame) {
    uVar10 = pCex->nRegs;
    iVar8 = 0;
    do {
      printf("Frame%02d ");
      if (0 < (pAbs->vPis).nSize) {
        uVar7 = 0;
        do {
          iVar4 = (pAbs->vPis).pArray[uVar7];
          lVar6 = (long)iVar4;
          if ((lVar6 < 1) || (pAbs->nObjsAlloc <= iVar4)) {
            __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                          ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
          }
          pWVar1 = pAbs->pObjs;
          printf("PI%d:",uVar7 & 0xffffffff);
          uVar9 = 0xffffffff;
          do {
            iVar4 = (int)uVar10 >> 5;
            uVar3 = uVar10 & 0x1f;
            uVar10 = uVar10 + 1;
            printf("%d",(ulong)(((uint)(&pCex[1].iPo)[iVar4] >> uVar3 & 1) != 0));
            uVar5 = pWVar1[lVar6].End - pWVar1[lVar6].Beg;
            uVar3 = -uVar5;
            if (0 < (int)uVar5) {
              uVar3 = uVar5;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < uVar3);
          putchar(0x20);
          uVar7 = uVar7 + 1;
        } while ((long)uVar7 < (long)(pAbs->vPis).nSize);
      }
      printf("FF:");
      uVar9 = uVar10;
      if ((int)uVar10 < pCex->nPis) {
        do {
          uVar10 = uVar9 + 1;
          printf("%d",(ulong)(((uint)(&pCex[1].iPo)[(int)uVar9 >> 5] >> (uVar9 & 0x1f) & 1) != 0));
          uVar9 = uVar10;
        } while ((int)uVar10 < pCex->nPis);
      }
      putchar(10);
      bVar2 = iVar8 < pCex->iFrame;
      iVar8 = iVar8 + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void Wlc_NtkPrintCex( Wlc_Ntk_t * p, Wlc_Ntk_t * pAbs, Abc_Cex_t * pCex )
{
    Wlc_Obj_t * pObj; int i, k, f, nBits = pCex ? pCex->nRegs : 0;
    if ( pCex == NULL )
    {
        printf( "The CEX is NULL.\n" );
        return;
    }
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        printf( "Frame%02d ", f );
        Wlc_NtkForEachPi( pAbs, pObj, i )
        {
            printf( "PI%d:", i );
            //printf( "%d(%d):", nBits, Wlc_ObjRange(pObj) );
            for ( k = 0; k < Wlc_ObjRange(pObj); k++ )
                printf( "%d", Abc_InfoHasBit(pCex->pData,  nBits++) );
            printf( " " );
        }
        printf( "FF:" );
        for ( k = 0; nBits < pCex->nPis; k++ )
            printf( "%d", Abc_InfoHasBit(pCex->pData, nBits++) );
        printf( "\n" );
    }

}